

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_rsn(REF_GRID ref_grid,REF_INT node,REF_DBL *r,REF_DBL *s,REF_DBL *n)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  REF_INT cell;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  REF_DBL dr [3];
  REF_INT nodes [27];
  double local_d8;
  double local_d0;
  double local_c8;
  REF_DBL *local_b8;
  ulong local_b0;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *r = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  local_b8 = s;
  uVar5 = ref_recon_normal(ref_grid,node,n);
  if (uVar5 == 0) {
    uVar8 = 0xffffffff;
    if (-1 < node) {
      uVar8 = 0xffffffff;
      if (node < ref_cell->ref_adj->nnode) {
        uVar8 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar8 != -1) {
      cell = ref_cell->ref_adj->item[(int)uVar8].ref;
      lVar7 = (long)(node * 0xf);
      dVar10 = 2.0;
      do {
        uVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x5de,"ref_recon_rsn",(ulong)uVar5,"cell nodes");
          return uVar5;
        }
        local_b0 = uVar8;
        if (0 < ref_cell->node_per) {
          lVar9 = 0;
          do {
            lVar6 = (long)local_a8[lVar9];
            if (local_a8[lVar9] != node) {
              pRVar3 = pRVar2->real;
              local_d8 = pRVar3[lVar6 * 0xf] - pRVar3[lVar7];
              local_d0 = pRVar3[lVar6 * 0xf + 1] - pRVar3[lVar7 + 1];
              local_c8 = pRVar3[lVar6 * 0xf + 2] - pRVar3[lVar7 + 2];
              uVar5 = ref_math_normalize(&local_d8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x5e7,"ref_recon_rsn",(ulong)uVar5,"norm dr");
                return uVar5;
              }
              dVar11 = n[2] * local_c8 + *n * local_d8 + n[1] * local_d0;
              if (dVar11 <= -dVar11) {
                dVar11 = -dVar11;
              }
              if (dVar11 < dVar10) {
                *r = local_d8;
                r[1] = local_d0;
                r[2] = local_c8;
                dVar10 = dVar11;
              }
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < ref_cell->node_per);
        }
        pRVar4 = ref_cell->ref_adj->item;
        iVar1 = pRVar4[(int)local_b0].next;
        uVar8 = (ulong)iVar1;
        if (uVar8 == 0xffffffffffffffff) {
          cell = -1;
        }
        else {
          cell = pRVar4[uVar8].ref;
        }
      } while (iVar1 != -1);
    }
    dVar10 = n[2] * r[2] + *r * *n + n[1] * r[1];
    *r = *r - *n * dVar10;
    r[1] = r[1] - n[1] * dVar10;
    r[2] = r[2] - dVar10 * n[2];
    uVar5 = ref_math_normalize(r);
    if (uVar5 == 0) {
      *local_b8 = n[1] * r[2] - r[1] * n[2];
      local_b8[1] = n[2] * *r - r[2] * *n;
      local_b8[2] = *n * r[1] - *r * n[1];
      uVar5 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5f7
             ,"ref_recon_rsn",(ulong)uVar5,"norm r");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5dc,
           "ref_recon_rsn",(ulong)uVar5,"norm");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn(REF_GRID ref_grid, REF_INT node, REF_DBL *r,
                                 REF_DBL *s, REF_DBL *n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_DBL small_dot, dot;
  REF_DBL dr[3];

  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;

  small_dot = 2.0;
  RSS(ref_recon_normal(ref_grid, node, n), "norm");
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (node != nodes[cell_node]) {
        dr[0] = ref_node_xyz(ref_node, 0, nodes[cell_node]) -
                ref_node_xyz(ref_node, 0, node);
        dr[1] = ref_node_xyz(ref_node, 1, nodes[cell_node]) -
                ref_node_xyz(ref_node, 1, node);
        dr[2] = ref_node_xyz(ref_node, 2, nodes[cell_node]) -
                ref_node_xyz(ref_node, 2, node);
        RSS(ref_math_normalize(dr), "norm dr");
        dot = ABS(ref_math_dot(dr, n));
        if (dot < small_dot) {
          small_dot = dot;
          r[0] = dr[0];
          r[1] = dr[1];
          r[2] = dr[2];
        }
      }
    }
  }

  dot = ref_math_dot(r, n);
  r[0] -= dot * n[0];
  r[1] -= dot * n[1];
  r[2] -= dot * n[2];
  RSS(ref_math_normalize(r), "norm r");

  ref_math_cross_product(n, r, s);

  return REF_SUCCESS;
}